

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factor.hpp
# Opt level: O1

void __thiscall
CholeskyFactor::reduce(CholeskyFactor *this,QpVector *buffer_d,HighsInt maxabsd,bool p_in_v)

{
  double dVar1;
  uint uVar2;
  int iVar3;
  pointer piVar4;
  ulong uVar5;
  HighsInt j;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  ulong uVar11;
  pointer pdVar12;
  pointer pdVar13;
  long lVar14;
  int iVar15;
  vector<double,_std::allocator<double>_> row_p;
  allocator_type local_61;
  QpVector *local_60;
  HighsInt *local_58;
  vector<double,_std::allocator<double>_> local_50;
  value_type_conflict1 local_38;
  
  if (((long)this->current_k != 0) && (this->uptodate == true)) {
    this->numberofreduces = this->numberofreduces + 1;
    local_38 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_50,(long)this->current_k,&local_38,&local_61);
    uVar2 = this->current_k;
    uVar5 = (ulong)uVar2;
    if (0 < (long)(int)uVar2) {
      iVar15 = this->current_k_max;
      pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[uVar11] = pdVar12[(uint)(iVar15 * maxabsd + (int)uVar11)];
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    lVar14 = (long)(int)uVar2 + -1;
    iVar15 = (int)lVar14;
    if (maxabsd < iVar15) {
      lVar8 = (long)this->current_k_max;
      pdVar13 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      lVar10 = (long)maxabsd;
      pdVar12 = pdVar13 + lVar8 * lVar10;
      pdVar13 = pdVar13 + (lVar10 + 1) * lVar8;
      do {
        if (0 < (int)uVar2) {
          uVar11 = 0;
          do {
            pdVar12[uVar11] = pdVar13[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar5 != uVar11);
        }
        lVar10 = lVar10 + 1;
        pdVar12 = pdVar12 + lVar8;
        pdVar13 = pdVar13 + lVar8;
      } while (lVar10 != lVar14);
    }
    if (0 < (int)uVar2) {
      iVar6 = this->current_k_max;
      pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      uVar11 = 0;
      do {
        pdVar12[(long)iVar6 * (long)iVar15 + uVar11] =
             local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar5 != uVar11);
    }
    if (0 < (int)uVar2) {
      iVar6 = this->current_k_max;
      pdVar13 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar12 = pdVar13 + 1;
      uVar11 = 0;
      do {
        lVar8 = uVar11 * (long)iVar6;
        dVar1 = pdVar13[(uint)(maxabsd + (int)lVar8)];
        lVar14 = (long)maxabsd;
        if (maxabsd < iVar15) {
          do {
            pdVar12[lVar14 + -1] = pdVar12[lVar14];
            lVar14 = lVar14 + 1;
          } while (iVar15 != lVar14);
        }
        pdVar13[uVar5 + lVar8 + -1] = dVar1;
        uVar11 = uVar11 + 1;
        pdVar12 = pdVar12 + iVar6;
      } while (uVar11 != uVar5);
    }
    j = 0;
    local_60 = buffer_d;
    if (uVar2 != 1) {
      if (!p_in_v) {
        if (0 < maxabsd) {
          iVar15 = maxabsd + 1;
          do {
            eliminate(this,&this->L,this->current_k + -1,iVar15 + -2,this->current_k_max,
                      this->current_k);
            iVar15 = iVar15 + -1;
          } while (1 < iVar15);
        }
        iVar15 = buffer_d->num_nz;
        if (0 < (long)iVar15) {
          piVar4 = (buffer_d->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_60 = (QpVector *)
                     (buffer_d->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
          local_58 = &local_60->num_nz + (long)maxabsd * 2;
          iVar6 = this->current_k;
          iVar7 = (iVar6 + -1) * this->current_k_max;
          pdVar12 = (this->L).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          lVar14 = 0;
          do {
            iVar3 = piVar4[lVar14];
            if (iVar3 != maxabsd) {
              pdVar13 = pdVar12 + -1;
              if (iVar3 < maxabsd) {
                pdVar13 = pdVar12;
              }
              iVar9 = iVar7 + iVar3;
              pdVar13[iVar9] =
                   pdVar13[iVar9] -
                   (*(double *)(&local_60->num_nz + (long)iVar3 * 2) / *(double *)local_58) *
                   pdVar12[(long)(iVar6 + iVar7) + -1];
            }
            lVar14 = lVar14 + 1;
          } while (iVar15 != lVar14);
        }
      }
      iVar15 = this->current_k;
      j = iVar15 + -1;
      if (1 < iVar15) {
        iVar6 = 0;
        do {
          eliminate(this,&this->L,iVar6,j,this->current_k_max,iVar15);
          iVar6 = iVar6 + 1;
          iVar15 = this->current_k;
          j = iVar15 + -1;
        } while (iVar6 < j);
      }
    }
    this->current_k = j;
    if (local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void reduce(const QpVector& buffer_d, const HighsInt maxabsd, bool p_in_v) {
    if (current_k == 0) {
      return;
    }
    if (!uptodate) {
      return;
    }
    numberofreduces++;

    unsigned p = maxabsd;  // col we push to the right and remove

    // start situation: p=3, current_k = 5
    // |1 x  | |x    |       |1   | |xxxxx|
    // | 1x  | |xx   |  ===  | 1  | | xxxx|
    // |  x1 | |xxx  |       |xxxx| |  xxx|
    // |  x 1| |xxxx |       |  1 | |   xx|
    //         |xxxxx|       |   1| |    x|
    // next step: move row/col p to the bottom/right

    //> save row p
    std::vector<double> row_p(current_k, 0.0);
    for (HighsInt i = 0; i < current_k; i++) {
      row_p[i] = L[p * current_k_max + i];
    }

    //> move all rows > p up by one row
    for (HighsInt row = p; row < current_k - 1; row++) {
      for (HighsInt i = 0; i < current_k; i++) {
        L[row * current_k_max + i] = L[(row + 1) * current_k_max + i];
      }
    }

    //> load row p
    for (HighsInt i = 0; i < current_k; i++) {
      L[(current_k - 1) * current_k_max + i] = row_p[i];
    }

    //> now move col p to the right in each row
    for (HighsInt row = 0; row < current_k; row++) {
      double p_entry = L[row * current_k_max + p];
      for (HighsInt col = p; col < current_k - 1; col++) {
        L[row * current_k_max + col] = L[row * current_k_max + col + 1];
      }
      L[row * current_k_max + current_k - 1] = p_entry;
    }

    if (current_k == 1) {
      current_k--;
      return;
    }

    if (!p_in_v) {
      // situation now:
      // |1   x| |x    |       |1   | |xxxxx|
      // | 1  x| |xx   |  ===  | 1  | | xxxx|
      // |  1 x| |xxx x|       |  1 | |  xx |
      // |   1x| |xxxxx|       |   1| |   x |
      //         |xx  x|       |xxxx| |  xxx|
      // next: remove nonzero entries in last column except for diagonal element
      for (HighsInt r = (HighsInt)p - 1; r >= 0; r--) {  // to current_k-1
        eliminate(L, current_k - 1, r, current_k_max, current_k);
      }

      // situation now:
      // |1   x| |x   x|        |xxxx | |1   |
      // | 1  x| |xx  x|  ===   | xxx | | 1  |
      // |  1 x| |xxx x|        |  xx | |  1 |
      // |   1x| |xxxxx|        |   x | |   1|
      //         |    x|        |xxxxx| |xxxx|
      // next: multiply product
      // new last row: old last row (first current_k-1 elements) + r *
      // R_current_k_current_k

      for (HighsInt i = 0; i < buffer_d.num_nz; i++) {
        HighsInt idx = buffer_d.index[i];
        if (idx == maxabsd) {
          continue;
        }
        if (idx < maxabsd) {
          L[(current_k - 1) * current_k_max + idx] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        } else {
          L[(current_k - 1) * current_k_max + idx - 1] +=
              -buffer_d.value[idx] / buffer_d.value[maxabsd] *
              L[(current_k - 1) * current_k_max + current_k - 1];
        }
      }
      // situation now: as above, but no more product
    }
    // next: eliminate last row
    for (HighsInt i = 0; i < current_k - 1; i++) {
      eliminate(L, i, current_k - 1, current_k_max, current_k);
    }
    current_k--;
  }